

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetViewports
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 NumViewports,
          Viewport *pViewports,Uint32 *RTWidth,Uint32 *RTHeight)

{
  Uint32 *pUVar1;
  undefined8 uVar2;
  Float32 FVar3;
  COMMAND_QUEUE_TYPE CVar4;
  uint uVar5;
  Viewport *extraout_RDX;
  Viewport *pVVar6;
  char *Args_2;
  char (*in_R9) [8];
  ulong uVar7;
  Float32 *Args_2_00;
  string msg;
  Uint32 NumViewports_local;
  undefined1 local_50 [12];
  float local_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  CVar4 = (this->m_Desc).QueueType;
  pVVar6 = pViewports;
  Args_2 = (char *)RTHeight;
  NumViewports_local = NumViewports;
  if (CVar4 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x390);
      std::__cxx11::string::~string((string *)&msg);
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x390);
    std::__cxx11::string::~string((string *)&msg);
    CVar4 = (this->m_Desc).QueueType;
    pVVar6 = extraout_RDX;
  }
  if ((~CVar4 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_
              ((String *)local_50,(Diligent *)(ulong)CVar4,(COMMAND_QUEUE_TYPE)pVVar6);
    Args_2 = " queue.";
    FormatString<char[13],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)"SetViewports",(char (*) [13])0x7e8bba,(char (*) [22])local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)local_50);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x390);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((1 < NumViewports) &&
     ((((this->m_pDevice).m_pObject)->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.MultiViewport ==
      DEVICE_FEATURE_STATE_DISABLED)) {
    FormatString<char[77]>
              (&msg,(char (*) [77])
                    "IDeviceContext::SetViewports: multi viewport is not supported by this device");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x395);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((*RTWidth == 0) || (*RTHeight == 0)) {
    *RTWidth = this->m_FramebufferWidth;
    *RTHeight = this->m_FramebufferHeight;
  }
  if (0xf < NumViewports) {
    Args_2 = (char *)&MAX_VIEWPORTS;
    FormatString<char[22],unsigned_int,char[22],unsigned_int,char[2]>
              (&msg,(Diligent *)"Number of viewports (",(char (*) [22])&NumViewports_local,
               (uint *)") exceeds the limit (",(char (*) [22])&MAX_VIEWPORTS,(uint *)0x801c00,
               (char (*) [2])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x39d);
    std::__cxx11::string::~string((string *)&msg);
    NumViewports = NumViewports_local;
  }
  uVar5 = 0x10;
  if (NumViewports < 0x10) {
    uVar5 = NumViewports;
  }
  this->m_NumViewports = uVar5;
  local_50._0_8_ = (pointer)0x0;
  local_50._8_4_ = (float)*RTWidth;
  local_44 = (float)*RTHeight;
  local_40._M_allocated_capacity = 0x3f80000000000000;
  pVVar6 = (Viewport *)local_50;
  if (NumViewports != 1) {
    pVVar6 = pViewports;
  }
  if (pViewports != (Viewport *)0x0) {
    pVVar6 = pViewports;
  }
  if (pVVar6 == (Viewport *)0x0) {
    FormatString<char[28]>(&msg,(char (*) [28])"pViewports must not be null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3a6);
    std::__cxx11::string::~string((string *)&msg);
  }
  Args_2_00 = &this->m_Viewports[0].MaxDepth;
  for (uVar7 = 0; uVar7 < this->m_NumViewports; uVar7 = uVar7 + 1) {
    FVar3 = pVVar6->TopLeftY;
    uVar2 = *(undefined8 *)&pVVar6->Width;
    ((Viewport *)(Args_2_00 + -5))->TopLeftX = pVVar6->TopLeftX;
    ((Viewport *)(Args_2_00 + -5))->TopLeftY = FVar3;
    *(undefined8 *)(Args_2_00 + -3) = uVar2;
    *(undefined8 *)(Args_2_00 + -1) = *(undefined8 *)&pVVar6->MinDepth;
    if ((float)Args_2_00[-3] < 0.0) {
      FormatString<char[27],float,char[2]>
                (&msg,(Diligent *)"Incorrect viewport width (",(char (*) [27])(Args_2_00 + -3),
                 (float *)0x801c00,(char (*) [2])Args_2);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3ab);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((float)Args_2_00[-2] < 0.0) {
      FormatString<char[28],float,char[2]>
                (&msg,(Diligent *)"Incorrect viewport height (",(char (*) [28])(Args_2_00 + -2),
                 (float *)0x801c00,(char (*) [2])Args_2);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3ac);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((float)*Args_2_00 < (float)Args_2_00[-1]) {
      Args_2 = (char *)Args_2_00;
      FormatString<char[33],float,char[3],float,char[2]>
                (&msg,(Diligent *)"Incorrect viewport depth range [",(char (*) [33])(Args_2_00 + -1)
                 ,(float *)0x800c44,(char (*) [3])Args_2_00,(float *)0x7906e1,
                 (char (*) [2])msg._M_dataplus._M_p);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3ad);
      std::__cxx11::string::~string((string *)&msg);
    }
    pVVar6 = pVVar6 + 1;
    Args_2_00 = Args_2_00 + 6;
  }
  pUVar1 = &(this->m_Stats).CommandCounters.SetViewports;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetViewports(
    Uint32          NumViewports,
    const Viewport* pViewports,
    Uint32&         RTWidth,
    Uint32&         RTHeight)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetViewports");

    if (NumViewports > 1)
    {
        DEV_CHECK_ERR(m_pDevice->GetFeatures().MultiViewport,
                      "IDeviceContext::SetViewports: multi viewport is not supported by this device");
    }
    if (RTWidth == 0 || RTHeight == 0)
    {
        RTWidth  = m_FramebufferWidth;
        RTHeight = m_FramebufferHeight;
    }

    DEV_CHECK_ERR(NumViewports < MAX_VIEWPORTS, "Number of viewports (", NumViewports, ") exceeds the limit (", MAX_VIEWPORTS, ")");
    m_NumViewports = (std::min)(MAX_VIEWPORTS, NumViewports);

    Viewport DefaultVP{RTWidth, RTHeight};
    // If no viewports are specified, use default viewport
    if (m_NumViewports == 1 && pViewports == nullptr)
    {
        pViewports = &DefaultVP;
    }
    DEV_CHECK_ERR(pViewports != nullptr, "pViewports must not be null");

    for (Uint32 vp = 0; vp < m_NumViewports; ++vp)
    {
        m_Viewports[vp] = pViewports[vp];
        DEV_CHECK_ERR(m_Viewports[vp].Width >= 0, "Incorrect viewport width (", m_Viewports[vp].Width, ")");
        DEV_CHECK_ERR(m_Viewports[vp].Height >= 0, "Incorrect viewport height (", m_Viewports[vp].Height, ")");
        DEV_CHECK_ERR(m_Viewports[vp].MaxDepth >= m_Viewports[vp].MinDepth, "Incorrect viewport depth range [", m_Viewports[vp].MinDepth, ", ", m_Viewports[vp].MaxDepth, "]");
    }

    ++m_Stats.CommandCounters.SetViewports;
}